

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_HexEncoding.h
# Opt level: O3

void axl::enc::impl::hexEncode<char,axl::enc::GetHexChar_u,axl::enc::impl::InsertSpace<char>>
               (char *dst,uchar_t *src,size_t size)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  
  bVar1 = *src;
  *dst = GetHexChar_u::operator()(unsigned_char)::charTable[bVar1 >> 4];
  dst[1] = GetHexChar_u::operator()(unsigned_char)::charTable[bVar1 & 0xf];
  if (1 < size) {
    pcVar3 = dst + 4;
    sVar2 = 1;
    do {
      bVar1 = src[sVar2];
      pcVar3[-2] = ' ';
      pcVar3[-1] = GetHexChar_u::operator()(unsigned_char)::charTable[bVar1 >> 4];
      *pcVar3 = GetHexChar_u::operator()(unsigned_char)::charTable[bVar1 & 0xf];
      sVar2 = sVar2 + 1;
      pcVar3 = pcVar3 + 3;
    } while (size != sVar2);
  }
  return;
}

Assistant:

void
hexEncode(
	T* dst,
	const uchar_t* src,
	size_t size
) {
	uchar_t x = src[0];
	*dst++ = GetHexChar()(x >> 4);
	*dst++ = GetHexChar()(x);

	for (size_t i = 1; i < size; i++) {
		uchar_t x = src[i];
		dst += InsertSpace()(dst, i);
		*dst++ = GetHexChar()(x >> 4);
		*dst++ = GetHexChar()(x);
	}
}